

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O2

void __thiscall
Diligent::TextureCube_GL::CopyTexSubimage
          (TextureCube_GL *this,GLContextState *GLState,CopyTexSubimageAttribs *Attribs)

{
  Box *pBVar1;
  undefined4 uVar2;
  GLenum err;
  string msg;
  
  GLContextState::BindTexture
            (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  uVar2 = 0;
  if ((ulong)(uint)Attribs->DstLayer < 6) {
    uVar2 = *(undefined4 *)
             (GetCubeMapFaceBindTarget(unsigned_int)::CubeMapFaceTargets +
             (ulong)(uint)Attribs->DstLayer * 4);
  }
  pBVar1 = Attribs->SrcBox;
  glCopyTexSubImage2D(uVar2,Attribs->DstMip,Attribs->DstX,Attribs->DstY,pBVar1->MinX,pBVar1->MinY,
                      pBVar1->MaxX - pBVar1->MinX);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x137,(char (*) [45])"Failed to copy subimage data to texture cube",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x137);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void TextureCube_GL::CopyTexSubimage(GLContextState& GLState, const CopyTexSubimageAttribs& Attribs)
{
    GLState.BindTexture(-1, m_BindTarget, GetGLHandle());

    const GLenum CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(Attribs.DstLayer);
    glCopyTexSubImage2D(CubeMapFaceBindTarget,
                        Attribs.DstMip,
                        Attribs.DstX,
                        Attribs.DstY,
                        Attribs.SrcBox.MinX,
                        Attribs.SrcBox.MinY,
                        Attribs.SrcBox.Width(),
                        Attribs.SrcBox.Height());
    DEV_CHECK_GL_ERROR("Failed to copy subimage data to texture cube");
}